

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3Fts3NextToken(char *zStr,int *pn)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  char *z1;
  
  pbVar2 = (byte *)0x0;
LAB_001a4f73:
  do {
    if (pbVar2 != (byte *)0x0) {
      *pn = (int)pbVar2 - (int)zStr;
      return zStr;
    }
    bVar1 = *zStr;
    pbVar2 = (byte *)zStr;
    if ((bVar1 == 0x22) || (bVar1 == 0x27)) {
LAB_001a4fbd:
      do {
        pbVar3 = pbVar2;
        pbVar2 = pbVar3 + 1;
        if (pbVar3[1] == 0) break;
      } while ((pbVar3[1] != bVar1) || (pbVar2 = pbVar3 + 2, pbVar3[2] == bVar1));
      goto LAB_001a4f73;
    }
    if (bVar1 == 0x5b) {
      pbVar3 = (byte *)zStr + 1;
      do {
        pbVar2 = pbVar3;
        bVar1 = *pbVar2;
        if (bVar1 == 0x5d) break;
        pbVar3 = pbVar2 + 1;
      } while (bVar1 != 0);
      if (bVar1 != 0) {
        pbVar2 = pbVar2 + 1;
      }
    }
    else {
      if (bVar1 == 0x60) goto LAB_001a4fbd;
      if (bVar1 == 0) {
        return (char *)0x0;
      }
      if (((char)bVar1 < '\0') || (sqlite3Fts3IsIdChar_isFtsIdChar[bVar1] != '\0')) {
        do {
          do {
            pbVar2 = pbVar2 + 1;
          } while ((long)(char)*pbVar2 < 0);
        } while (sqlite3Fts3IsIdChar_isFtsIdChar[(char)*pbVar2] != '\0');
      }
      else {
        zStr = (char *)((byte *)zStr + 1);
        pbVar2 = (byte *)0x0;
      }
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE const char *sqlite3Fts3NextToken(const char *zStr, int *pn){
  const char *z1;
  const char *z2 = 0;

  /* Find the start of the next token. */
  z1 = zStr;
  while( z2==0 ){
    char c = *z1;
    switch( c ){
      case '\0': return 0;        /* No more tokens here */
      case '\'':
      case '"':
      case '`': {
        z2 = z1;
        while( *++z2 && (*z2!=c || *++z2==c) );
        break;
      }
      case '[':
        z2 = &z1[1];
        while( *z2 && z2[0]!=']' ) z2++;
        if( *z2 ) z2++;
        break;

      default:
        if( sqlite3Fts3IsIdChar(*z1) ){
          z2 = &z1[1];
          while( sqlite3Fts3IsIdChar(*z2) ) z2++;
        }else{
          z1++;
        }
    }
  }

  *pn = (int)(z2-z1);
  return z1;
}